

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sanitize.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3e00::FlexFloatSanitizeTest_LessThanDenormalSmallest1_Test::TestBody
          (FlexFloatSanitizeTest_LessThanDenormalSmallest1_Test *this)

{
  char *message;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  string local_48;
  double val;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> local_20;
  
  fesetround(0xc00);
  val = 0.015625;
  local_20.v.value = 0.0;
  local_20.v.desc.exp_bits = '\x03';
  local_20.v.desc.frac_bits = '\x03';
  flexfloat<(unsigned_char)'\x03',_(unsigned_char)'\x03'>::flexfloat<double>(&local_20,&val);
  bitstring<(unsigned_char)3,(unsigned_char)3>(&local_48,&local_20);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0-000-000\"","bitstring(ff_val)",(char (*) [10])"0-000-000",
             &local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/oprecomp[P]flexfloat/test/sanitize.cpp"
               ,0x47,message);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FlexFloatSanitizeTest, LessThanDenormalSmallest1) {
    fesetround(FE_TOWARDZERO);
    const double val = 0.015625;
    flexfloat<3, 3> ff_val;
    ff_val = val;
    EXPECT_EQ("0-000-000", bitstring(ff_val));
}